

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

lys_type * lyp_get_next_union_type(lys_type *type,lys_type *prev_type,int *found)

{
  lys_type *local_30;
  lys_type *ret;
  uint i;
  int *found_local;
  lys_type *prev_type_local;
  lys_type *type_local;
  
  local_30 = (lys_type *)0x0;
  for (prev_type_local = type; (prev_type_local->info).bits.count == 0;
      prev_type_local = &prev_type_local->der->type) {
    if (prev_type_local->der == (lys_tpdf *)0x0) {
      __assert_fail("type->der",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                    ,0x7b2,
                    "struct lys_type *lyp_get_next_union_type(struct lys_type *, struct lys_type *, int *)"
                   );
    }
  }
  ret._4_4_ = 0;
  do {
    if ((prev_type_local->info).bits.count <= ret._4_4_) {
      return local_30;
    }
    if (*(int *)((long)(prev_type_local->info).bits.bit + (ulong)ret._4_4_ * 0x40) == 0xb) {
      local_30 = lyp_get_next_union_type
                           ((lys_type *)
                            ((long)(prev_type_local->info).bits.bit + (ulong)ret._4_4_ * 0x40),
                            prev_type,found);
      if (local_30 != (lys_type *)0x0) {
        return local_30;
      }
    }
    else {
      if ((prev_type == (lys_type *)0x0) || (*found != 0)) {
        return (lys_type *)((long)(prev_type_local->info).bits.bit + (ulong)ret._4_4_ * 0x40);
      }
      if ((lys_type *)((long)(prev_type_local->info).bits.bit + (ulong)ret._4_4_ * 0x40) ==
          prev_type) {
        *found = 1;
      }
    }
    ret._4_4_ = ret._4_4_ + 1;
  } while( true );
}

Assistant:

struct lys_type *
lyp_get_next_union_type(struct lys_type *type, struct lys_type *prev_type, int *found)
{
    unsigned int i;
    struct lys_type *ret = NULL;

    while (!type->info.uni.count) {
        assert(type->der); /* at least the direct union type has to have type specified */
        type = &type->der->type;
    }

    for (i = 0; i < type->info.uni.count; ++i) {
        if (type->info.uni.types[i].base == LY_TYPE_UNION) {
            ret = lyp_get_next_union_type(&type->info.uni.types[i], prev_type, found);
            if (ret) {
                break;
            }
            continue;
        }

        if (!prev_type || *found) {
            ret = &type->info.uni.types[i];
            break;
        }

        if (&type->info.uni.types[i] == prev_type) {
            *found = 1;
        }
    }

    return ret;
}